

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lexer.cpp
# Opt level: O0

expected<Miss2Identifier,_Miss2Identifier::Error> *
Miss2Identifier::match
          (expected<Miss2Identifier,_Miss2Identifier::Error> *__return_storage_ptr__,
          string_view *value,Options *options)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pcVar4;
  value_type local_180;
  out_of_range *anon_var_0;
  value_type local_128;
  Error local_f8;
  unexpected_type<Miss2Identifier::Error> local_f4;
  variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
  local_f0 [24];
  value_type local_d8;
  allocator<char> local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_6c;
  undefined1 auStack_68 [4];
  int index_value;
  basic_string_view<char,_std::char_traits<char>_> index;
  basic_string_view<char,_std::char_traits<char>_> ident;
  ulong local_40;
  size_t i;
  unexpected_type<Miss2Identifier::Error> local_30;
  byte local_29;
  ulong uStack_28;
  bool is_number_index;
  size_t begin_index;
  Options *options_local;
  string_view *value_local;
  
  uStack_28 = 0xffffffffffffffff;
  local_29 = 1;
  begin_index = (size_t)options;
  options_local = (Options *)value;
  value_local = (string_view *)__return_storage_ptr__;
  bVar1 = is_identifier(value,options);
  if (bVar1) {
    for (local_40 = 0;
        sVar3 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)options_local),
        local_40 < sVar3; local_40 = local_40 + 1) {
      pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         ((basic_string_view<char,_std::char_traits<char>_> *)options_local,local_40
                         );
      if (*pcVar4 == '[') {
        if (uStack_28 != 0xffffffffffffffff) {
          ident.__size._0_4_ = 1;
          ident.__size._4_4_ =
               nonstd::make_unexpected<Miss2Identifier::Error>((Error *)&ident.__size);
          nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
                    (__return_storage_ptr__,
                     (unexpected_type<Miss2Identifier::Error> *)((long)&ident.__size + 4));
          return __return_storage_ptr__;
        }
        uStack_28 = local_40;
      }
      else {
        pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)options_local,
                            local_40);
        if (*pcVar4 == ']') {
          join_0x00000010_0x00000000_ =
               libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)options_local,0,
                          uStack_28);
          _auStack_68 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::
                        substr((basic_string_view<char,_std::char_traits<char>_> *)options_local,
                               uStack_28 + 1,local_40 - (uStack_28 + 1));
          if ((local_29 & 1) == 0) {
            local_128.identifier.__data = (value_type *)index.__size;
            local_128.identifier.__size = (size_type)ident.__data;
            eggs::variants::
            variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
            ::
            variant<libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>&,1ul,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
                      ((variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
                        *)&anon_var_0,(basic_string_view<char,_std::char_traits<char>_> *)auStack_68
                      );
            std::experimental::
            optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::optional(&local_128.index,
                       (variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
                        *)&anon_var_0);
            nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
                      (__return_storage_ptr__,&local_128);
            return __return_storage_ptr__;
          }
          std::allocator<char>::allocator();
          libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
          to_string<std::allocator<char>>
                    (&local_90,(basic_string_view<char,std::char_traits<char>> *)auStack_68,
                     &local_91);
          iVar2 = std::__cxx11::stoi(&local_90,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_90);
          std::allocator<char>::~allocator(&local_91);
          local_6c = iVar2;
          if (-1 < iVar2) {
            local_d8.identifier.__data = (value_type *)index.__size;
            local_d8.identifier.__size = (size_type)ident.__data;
            eggs::variants::
            variant<unsigned_long,libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>>
            ::variant<int&,0ul,unsigned_long>(local_f0,&local_6c);
            std::experimental::
            optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::optional(&local_d8.index,
                       (variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>
                        *)local_f0);
            nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
                      (__return_storage_ptr__,&local_d8);
            return __return_storage_ptr__;
          }
          local_f8 = NegativeIndex;
          local_f4 = nonstd::make_unexpected<Miss2Identifier::Error>(&local_f8);
          nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
                    (__return_storage_ptr__,&local_f4);
          return __return_storage_ptr__;
        }
        if ((uStack_28 != 0xffffffffffffffff) &&
           (((pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::
                       operator[]((basic_string_view<char,_std::char_traits<char>_> *)options_local,
                                  local_40), *pcVar4 < '0' ||
             (pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::
                       operator[]((basic_string_view<char,_std::char_traits<char>_> *)options_local,
                                  local_40), '9' < *pcVar4)) &&
            (pcVar4 = libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>::
                      operator[]((basic_string_view<char,_std::char_traits<char>_> *)options_local,
                                 local_40), *pcVar4 != '-')))) {
          local_29 = 0;
        }
      }
    }
    local_180.identifier.__data = *(value_type **)options_local;
    local_180.identifier.__size._0_1_ = options_local->optimize_andor;
    local_180.identifier.__size._1_1_ = options_local->optimize_zero_floats;
    local_180.identifier.__size._2_1_ = options_local->entity_tracking;
    local_180.identifier.__size._3_1_ = options_local->script_name_check;
    local_180.identifier.__size._4_1_ = options_local->fswitch;
    local_180.identifier.__size._5_1_ = options_local->allow_break_continue;
    local_180.identifier.__size._6_1_ = options_local->scope_then_label;
    local_180.identifier.__size._7_1_ = options_local->farrays;
    std::experimental::
    optional<eggs::variants::variant<unsigned_long,_libcxx_strviewclone::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::optional(&local_180.index);
    nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
              (__return_storage_ptr__,&local_180);
  }
  else {
    i._4_4_ = 0;
    local_30 = nonstd::make_unexpected<Miss2Identifier::Error>((Error *)((long)&i + 4));
    nonstd::expected<Miss2Identifier,_Miss2Identifier::Error>::expected<true,_0>
              (__return_storage_ptr__,&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

auto Miss2Identifier::match(const string_view& value, const Options& options) -> expected<Miss2Identifier, Error>
{
    size_t begin_index = std::string::npos;
    bool is_number_index = true;

    if(!Miss2Identifier::is_identifier(value, options))
        return make_unexpected(Miss2Identifier::InvalidIdentifier);

    for(size_t i = 0; i < value.size(); ++i)
    {
        if(value[i] == '[')
        {
            if(begin_index != std::string::npos)
                return make_unexpected(Miss2Identifier::NestingOfArrays);

            begin_index = i;
        }
        else if(value[i] == ']')
        {
            auto ident = value.substr(0, begin_index);
            auto index = value.substr(begin_index + 1, i - (begin_index + 1));
            try
            {
                using index_type = decltype(Miss2Identifier::index);
                if(is_number_index)
                {
                    int index_value = std::stoi(index.to_string());
                    if(index_value >= 0)
                        return Miss2Identifier{ ident, index_type(index_value) };
                    else
                        return make_unexpected(Miss2Identifier::NegativeIndex);
                }
                else
                    return Miss2Identifier{ ident, index_type(index) };
            }
            catch(const std::out_of_range&)
            {
                return make_unexpected(Miss2Identifier::OutOfRange);
            }
        }
        else if(begin_index != std::string::npos)
        {
            if(!((value[i] >= '0' && value[i] <= '9') || (value[i] == '-')))
                is_number_index = false;
        }
    }

    return Miss2Identifier{ value, nullopt };
}